

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_env_set_flags(MDB_env *env,uint flag,int onoff)

{
  int onoff_local;
  uint flag_local;
  MDB_env *env_local;
  
  if ((flag & 0xfeeaffff) == 0) {
    if (onoff == 0) {
      env->me_flags = (flag ^ 0xffffffff) & env->me_flags;
    }
    else {
      env->me_flags = flag | env->me_flags;
    }
    env_local._4_4_ = 0;
  }
  else {
    env_local._4_4_ = 0x16;
  }
  return env_local._4_4_;
}

Assistant:

int ESECT
mdb_env_set_flags(MDB_env *env, unsigned int flag, int onoff)
{
	if (flag & ~CHANGEABLE)
		return EINVAL;
	if (onoff)
		env->me_flags |= flag;
	else
		env->me_flags &= ~flag;
	return MDB_SUCCESS;
}